

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O1

ostream * subsat::operator<<(ostream *os,Constraint *c)

{
  uint uVar1;
  Lit lit;
  long lVar2;
  Constraint *__range1;
  bool bVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  uVar1 = c->m_size;
  if ((ulong)uVar1 != 0) {
    bVar3 = true;
    lVar2 = 0;
    do {
      lit.m_index = *(index_type *)((long)&c->m_literals[0].m_index + lVar2);
      if (bVar3) {
        bVar3 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      }
      operator<<(os,lit);
      lVar2 = lVar2 + 4;
    } while ((ulong)uVar1 << 2 != lVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," }",2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Constraint const& c)
{
  os << "{ ";
  bool first = true;
  for (Lit lit : c) {
    if (first) {
      first = false;
    } else {
      os << ", ";
    }
    os << lit;
  }
  os << " }";
  return os;
}